

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O0

nbt_node * nbt_filter_inplace(nbt_node *tree,nbt_predicate_t filter,void *aux)

{
  _Bool _Var1;
  list_head **__ptr;
  nbt_node *pnVar2;
  nbt_list *local_50;
  nbt_list *cur;
  nbt_list *list;
  list_head *n;
  list_head *pos;
  void *aux_local;
  nbt_predicate_t filter_local;
  nbt_node *tree_local;
  
  if (filter == (nbt_predicate_t)0x0) {
    __assert_fail("filter",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x159,"nbt_node *nbt_filter_inplace(nbt_node *, nbt_predicate_t, void *)");
  }
  if (tree == (nbt_node *)0x0) {
    tree_local = (nbt_node *)0x0;
  }
  else {
    _Var1 = (*filter)(tree,aux);
    if (_Var1) {
      tree_local = tree;
      if ((tree->type == TAG_LIST) || (tree->type == TAG_COMPOUND)) {
        if (tree->type == TAG_LIST) {
          local_50 = (tree->payload).tag_list;
        }
        else {
          local_50 = (tree->payload).tag_list;
        }
        n = (local_50->entry).flink;
        list = (nbt_list *)n->flink;
        while (n != &local_50->entry) {
          __ptr = &n[-1].flink;
          pnVar2 = nbt_filter_inplace((nbt_node *)*__ptr,filter,aux);
          *__ptr = (list_head *)pnVar2;
          if (*__ptr == (list_head *)0x0) {
            list_del(n);
            free(__ptr);
          }
          n = (list_head *)list;
          list = (nbt_list *)(list->entry).blink;
        }
      }
    }
    else {
      nbt_free(tree);
      tree_local = (nbt_node *)0x0;
    }
  }
  return tree_local;
}

Assistant:

nbt_node* nbt_filter_inplace(nbt_node* tree, nbt_predicate_t filter, void* aux)
{
    assert(filter);

    if(tree == NULL)               return                 NULL;
    if(!filter(tree, aux))         return nbt_free(tree), NULL;
    if(tree->type != TAG_LIST &&
       tree->type != TAG_COMPOUND) return tree;

    struct list_head* pos;
    struct list_head* n;
    struct nbt_list* list = tree->type == TAG_LIST ? tree->payload.tag_list : tree->payload.tag_compound;

    list_for_each_safe(pos, n, &list->entry)
    {
        struct nbt_list* cur = list_entry(pos, struct nbt_list, entry);

        cur->data = nbt_filter_inplace(cur->data, filter, aux);

        if(cur->data == NULL)
        {
            list_del(pos);
            free(cur);
        }
    }

    return tree;
}